

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# privsock.c
# Opt level: O3

void priv_sock_send_buf(int fd,char *buf,uint len)

{
  uint uVar1;
  int iVar2;
  ssize_t sVar3;
  ssize_t sVar4;
  hostent *phVar5;
  uint extraout_EDX;
  char *buf_00;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  msghdr *__message;
  sockaddr *__addr;
  char *__cp;
  undefined1 *puVar10;
  char *pcVar11;
  undefined4 uStack_1a4;
  char acStack_1a0 [24];
  sockaddr sStack_188;
  char *pcStack_178;
  char *pcStack_170;
  ulong uStack_168;
  code *pcStack_160;
  sockaddr sStack_14c;
  undefined4 uStack_13c;
  char *pcStack_138;
  char *pcStack_130;
  code *pcStack_128;
  undefined1 uStack_119;
  iovec iStack_118;
  msghdr mStack_108;
  undefined1 auStack_d0 [16];
  code *pcStack_c0;
  undefined1 uStack_a9;
  iovec iStack_a8;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined4 uStack_88;
  undefined1 auStack_78 [48];
  undefined8 uStack_48;
  ulong uStack_38;
  char *pcStack_30;
  
  pcVar6 = (char *)(ulong)(uint)fd;
  priv_sock_send_int(fd,len);
  buf_00 = buf;
  __cp = pcVar6;
  sVar3 = writen(fd,buf,(ulong)len);
  if ((uint)sVar3 == len) {
    return;
  }
  priv_sock_send_buf_cold_1();
  iVar2 = (int)__cp;
  pcVar11 = (char *)((ulong)__cp & 0xffffffff);
  uStack_48._0_4_ = 0x106434;
  uStack_48._4_4_ = 0;
  pcVar9 = buf_00;
  uStack_38 = (ulong)len;
  pcStack_30 = buf;
  uVar1 = priv_sock_get_int(iVar2);
  uStack_88 = SUB84(pcVar9,0);
  if (extraout_EDX < uVar1) {
    uStack_48._0_4_ = 0x10645c;
    uStack_48._4_4_ = 0;
    priv_sock_recv_buf_cold_2();
  }
  else {
    pcVar6 = (char *)(ulong)uVar1;
    uStack_48._0_4_ = 0x106448;
    uStack_48._4_4_ = 0;
    pcVar9 = buf_00;
    __cp = pcVar11;
    sVar3 = readn(iVar2,buf_00,(ulong)uVar1);
    uStack_88 = SUB84(pcVar9,0);
    if (uVar1 == (uint)sVar3) {
      return;
    }
  }
  uStack_48 = priv_sock_send_fd;
  priv_sock_recv_buf_cold_1();
  iStack_a8.iov_base = &uStack_a9;
  uStack_a9 = 0;
  auStack_78._32_8_ = &uStack_98;
  auStack_78._40_8_ = 0x18;
  uStack_90 = 0x100000001;
  uStack_98 = 0x14;
  auStack_78._0_8_ = (void *)0x0;
  auStack_78._8_4_ = 0;
  auStack_78._16_8_ = &iStack_a8;
  auStack_78._24_8_ = 1;
  uStack_48 = (code *)((ulong)uStack_48 & 0xffffffff00000000);
  iStack_a8.iov_len = 1;
  pcStack_c0 = (code *)0x106d18;
  sVar4 = sendmsg((int)__cp,(msghdr *)auStack_78,0);
  if ((int)sVar4 == 1) {
    return;
  }
  pcStack_c0 = recv_fd;
  send_fd_cold_1();
  iStack_118.iov_base = &uStack_119;
  mStack_108.msg_iov = &iStack_118;
  iStack_118.iov_len = 1;
  __message = &mStack_108;
  mStack_108.msg_name = (void *)0x0;
  mStack_108.msg_namelen = 0;
  mStack_108.msg_iovlen = 1;
  mStack_108.msg_control = auStack_d0;
  mStack_108.msg_controllen = 0x18;
  mStack_108.msg_flags = 0;
  pcStack_c0 = (code *)CONCAT44(pcStack_c0._4_4_,0xffffffff);
  pcStack_128 = (code *)0x106d7c;
  sVar4 = recvmsg((int)__cp,__message,0);
  if ((int)sVar4 == 1) {
    if ((mStack_108.msg_controllen < 0x10) ||
       ((undefined1 *)mStack_108.msg_control == (undefined1 *)0x0)) goto LAB_00106da5;
    if (*(int *)((long)mStack_108.msg_control + 0x10) != -1) {
      return;
    }
  }
  else {
    pcStack_128 = (code *)0x106da5;
    recv_fd_cold_1();
LAB_00106da5:
    pcStack_128 = (code *)0x106daa;
    recv_fd_cold_3();
  }
  pcStack_128 = tcp_server;
  recv_fd_cold_2();
  uVar7 = (ulong)__message & 0xffffffff;
  pcStack_160 = (code *)0x106dcd;
  pcStack_138 = buf_00;
  pcStack_130 = pcVar11;
  pcStack_128 = (code *)pcVar6;
  uVar1 = socket(2,1,0);
  if ((int)uVar1 < 0) {
    pcStack_160 = (code *)0x106e81;
    tcp_server_cold_3();
LAB_00106e81:
    iVar2 = (int)buf_00;
    pcStack_160 = (code *)0x106e88;
    tcp_server_cold_2();
  }
  else {
    buf_00 = (char *)(ulong)uVar1;
    sStack_14c.sa_data[10] = '\0';
    sStack_14c.sa_data[0xb] = '\0';
    sStack_14c.sa_data[0xc] = '\0';
    sStack_14c.sa_data[0xd] = '\0';
    sStack_14c.sa_data[2] = '\0';
    sStack_14c.sa_data[3] = '\0';
    sStack_14c.sa_data[4] = '\0';
    sStack_14c.sa_data[5] = '\0';
    sStack_14c.sa_data[6] = '\0';
    sStack_14c.sa_data[7] = '\0';
    sStack_14c.sa_data[8] = '\0';
    sStack_14c.sa_data[9] = '\0';
    sStack_14c.sa_family = 2;
    sStack_14c.sa_data._0_2_ = (ushort)uVar7 << 8 | (ushort)uVar7 >> 8;
    uVar7 = CONCAT62((int6)(uVar7 >> 0x10),sStack_14c.sa_data._0_2_);
    if (__cp == (char *)0x0) {
LAB_00106e2d:
      uStack_13c = 1;
      pcStack_160 = (code *)0x106e4f;
      setsockopt(uVar1,1,2,&uStack_13c,4);
      pcStack_160 = (code *)0x106e60;
      iVar2 = bind(uVar1,&sStack_14c,0x10);
      if (iVar2 != -1) {
        pcStack_160 = (code *)0x106e71;
        listen(uVar1,0x400);
        return;
      }
      goto LAB_00106e81;
    }
    pcStack_160 = (code *)0x106e0f;
    iVar2 = inet_pton(2,__cp,sStack_14c.sa_data + 2);
    if (iVar2 != 0) goto LAB_00106e2d;
    pcStack_160 = (code *)0x106e1b;
    pcVar6 = __cp;
    phVar5 = gethostbyname(__cp);
    iVar2 = (int)pcVar6;
    if (phVar5 != (hostent *)0x0) {
      sStack_14c.sa_data._2_4_ = *(undefined4 *)*phVar5->h_addr_list;
      goto LAB_00106e2d;
    }
  }
  pcStack_160 = tcp_client;
  tcp_server_cold_1();
  puVar10 = (undefined1 *)0x2;
  __addr = (sockaddr *)0x1;
  pcStack_178 = buf_00;
  pcStack_170 = __cp;
  uStack_168 = (ulong)extraout_EDX;
  pcStack_160 = (code *)uVar7;
  uVar1 = socket(2,1,0);
  if (-1 < (int)uVar1) {
    if (iVar2 != 0) {
      uStack_1a4 = 1;
      setsockopt(uVar1,1,2,&uStack_1a4,4);
      acStack_1a0[0] = '\0';
      acStack_1a0[1] = '\0';
      acStack_1a0[2] = '\0';
      acStack_1a0[3] = '\0';
      acStack_1a0[4] = '\0';
      acStack_1a0[5] = '\0';
      acStack_1a0[6] = '\0';
      acStack_1a0[7] = '\0';
      acStack_1a0[8] = '\0';
      acStack_1a0[9] = '\0';
      acStack_1a0[10] = '\0';
      acStack_1a0[0xb] = '\0';
      acStack_1a0[0xc] = '\0';
      acStack_1a0[0xd] = '\0';
      acStack_1a0[0xe] = '\0';
      acStack_1a0[0xf] = '\0';
      getlocalip(acStack_1a0);
      __addr = &sStack_188;
      sStack_188.sa_data[6] = '\0';
      sStack_188.sa_data[7] = '\0';
      sStack_188.sa_data[8] = '\0';
      sStack_188.sa_data[9] = '\0';
      sStack_188.sa_data[10] = '\0';
      sStack_188.sa_data[0xb] = '\0';
      sStack_188.sa_data[0xc] = '\0';
      sStack_188.sa_data[0xd] = '\0';
      sStack_188.sa_family = 2;
      sStack_188.sa_data._0_2_ = (short)iVar2;
      sStack_188.sa_data._2_4_ = inet_addr(acStack_1a0);
      puVar10 = (undefined1 *)(ulong)uVar1;
      iVar2 = bind(uVar1,__addr,0x10);
      if (iVar2 < 0) goto LAB_00106f37;
    }
    return;
  }
  tcp_client_cold_2();
LAB_00106f37:
  tcp_client_cold_1();
  *puVar10 = 0x3f;
  uVar8 = (uint)__addr;
  uVar1 = (uVar8 & 0xf000) - 0x1000;
  if ((uVar1 < 0xc000) && (uVar1 = uVar1 >> 0xc, (0xaabU >> (uVar1 & 0x1f) & 1) != 0)) {
    *puVar10 = (&DAT_00108f04)[uVar1];
  }
  if ((uVar8 >> 8 & 1) != 0) {
    puVar10[1] = 0x72;
  }
  if ((char)__addr < '\0') {
    puVar10[2] = 0x77;
  }
  if (((ulong)__addr & 0x40) != 0) {
    puVar10[3] = 0x78;
  }
  if (((ulong)__addr & 0x20) != 0) {
    puVar10[4] = 0x72;
  }
  if (((ulong)__addr & 0x10) != 0) {
    puVar10[5] = 0x77;
  }
  if (((ulong)__addr & 8) != 0) {
    puVar10[6] = 0x78;
  }
  if (((ulong)__addr & 4) != 0) {
    puVar10[7] = 0x72;
  }
  if (((ulong)__addr & 2) != 0) {
    puVar10[8] = 0x77;
  }
  if (((ulong)__addr & 1) != 0) {
    puVar10[9] = 0x78;
  }
  if ((uVar8 >> 0xb & 1) != 0) {
    puVar10[3] = (puVar10[3] == 'x') << 5 | 0x53;
  }
  if ((uVar8 >> 10 & 1) != 0) {
    puVar10[6] = (puVar10[6] == 'x') << 5 | 0x53;
  }
  if ((uVar8 >> 9 & 1) != 0) {
    puVar10[9] = (puVar10[9] == 'x') << 5 | 0x53;
  }
  return;
}

Assistant:

void priv_sock_send_buf(int fd, const char *buf, unsigned int len) {
  // send the str len
  priv_sock_send_int(fd, len);
  // send the str
  int ret = writen(fd, buf, len);
  if (ret != (int) len) {
    fprintf(stderr, "priv_sock_send_buf error\n");
    exit(EXIT_FAILURE);
  }
}